

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_close_sockets.c
# Opt level: O1

void ares_close_connection(ares_conn_t *conn,ares_status_t requeue_status)

{
  ares_server_t *paVar1;
  ares_channel_t *channel;
  ares_llist_node_t *node;
  ares_query_t *query;
  ares_timeval_t now;
  ares_timeval_t local_30;
  
  paVar1 = conn->server;
  channel = paVar1->channel;
  node = (ares_llist_node_t *)ares_htable_asvp_get_direct(channel->connnode_by_socket,conn->fd);
  ares_llist_node_claim(node);
  ares_htable_asvp_remove(channel->connnode_by_socket,conn->fd);
  if ((conn->flags & ARES_CONN_FLAG_TCP) != ARES_CONN_FLAG_NONE) {
    paVar1->tcp_conn = (ares_conn_t *)0x0;
  }
  ares_buf_destroy(conn->in_buf);
  ares_buf_destroy(conn->out_buf);
  ares_tvnow(&local_30);
  query = (ares_query_t *)ares_llist_first_val(conn->queries_to_conn);
  if (query != (ares_query_t *)0x0) {
    do {
      ares_requeue_query(query,&local_30,requeue_status,ARES_TRUE,(ares_dns_record_t *)0x0,
                         (ares_array_t **)0x0);
      query = (ares_query_t *)ares_llist_first_val(conn->queries_to_conn);
    } while (query != (ares_query_t *)0x0);
  }
  ares_llist_destroy(conn->queries_to_conn);
  ares_conn_sock_state_cb_update(conn,ARES_CONN_STATE_NONE);
  ares_socket_close(channel,conn->fd);
  ares_free(conn);
  return;
}

Assistant:

void ares_close_connection(ares_conn_t *conn, ares_status_t requeue_status)
{
  ares_server_t  *server  = conn->server;
  ares_channel_t *channel = server->channel;

  /* Unlink */
  ares_llist_node_claim(
    ares_htable_asvp_get_direct(channel->connnode_by_socket, conn->fd));
  ares_htable_asvp_remove(channel->connnode_by_socket, conn->fd);

  if (conn->flags & ARES_CONN_FLAG_TCP) {
    server->tcp_conn = NULL;
  }

  ares_buf_destroy(conn->in_buf);
  ares_buf_destroy(conn->out_buf);

  /* Requeue queries to other connections */
  ares_requeue_queries(conn, requeue_status);

  ares_llist_destroy(conn->queries_to_conn);

  ares_conn_sock_state_cb_update(conn, ARES_CONN_STATE_NONE);

  ares_socket_close(channel, conn->fd);

  ares_free(conn);
}